

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcowptr.h
# Opt level: O1

ssize_t __thiscall
vcow_ptr<VRle::Data>::write(vcow_ptr<VRle::Data> *this,int __fd,void *__buf,size_t __n)

{
  model *pmVar1;
  VPoint VVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  model *pmVar6;
  type tmp;
  vcow_ptr<VRle::Data> local_30;
  vcow_ptr<VRle::Data> local_28;
  
  if ((this->mModel->mRef).super___atomic_base<unsigned_long>._M_i != 1) {
    pmVar1 = this->mModel;
    pmVar6 = (model *)operator_new(0x40);
    (pmVar6->mRef).super___atomic_base<unsigned_long>._M_i = 1;
    std::vector<VRle::Span,_std::allocator<VRle::Span>_>::vector
              (&(pmVar6->mValue).mSpans,&(pmVar1->mValue).mSpans);
    VVar2 = (pmVar1->mValue).mOffset;
    iVar4 = (pmVar1->mValue).mBbox.x1;
    iVar5 = (pmVar1->mValue).mBbox.y1;
    uVar3 = *(undefined8 *)((long)&(pmVar1->mValue).mBbox.x2 + 1);
    *(undefined8 *)((long)&(pmVar6->mValue).mBbox.x1 + 1) =
         *(undefined8 *)((long)&(pmVar1->mValue).mBbox.x1 + 1);
    *(undefined8 *)((long)&(pmVar6->mValue).mBbox.x2 + 1) = uVar3;
    (pmVar6->mValue).mOffset = VVar2;
    (pmVar6->mValue).mBbox.x1 = iVar4;
    (pmVar6->mValue).mBbox.y1 = iVar5;
    local_30.mModel = (model *)0x0;
    local_28 = (vcow_ptr<VRle::Data>)this->mModel;
    this->mModel = pmVar6;
    ~vcow_ptr(&local_28);
    ~vcow_ptr(&local_30);
  }
  return (ssize_t)&this->mModel->mValue;
}

Assistant:

auto write() -> element_type&
    {
        if (!unique()) *this = vcow_ptr(read());

        return mModel->mValue;
    }